

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_dist.hpp
# Opt level: O0

result_type_conflict1 __thiscall
trng::normal_dist<float>::cdf(normal_dist<float> *this,result_type_conflict1 x)

{
  param_type *in_RDI;
  float fVar1;
  
  param_type::mu(in_RDI);
  param_type::sigma(in_RDI);
  fVar1 = math::Phi(4.525643e-39);
  return fVar1;
}

Assistant:

cdf(result_type x) const {
      x -= P.mu();
      x /= P.sigma();
      return math::Phi(x);
    }